

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpris-player.c
# Opt level: O0

void media_player2_player_proxy_get_property
               (GObject *object,guint prop_id,GValue *value,GParamSpec *pspec)

{
  GDBusPropertyInfo *pGVar1;
  undefined8 uVar2;
  long lVar3;
  GVariant *variant;
  _ExtendedGDBusPropertyInfo *info;
  GParamSpec *pspec_local;
  GValue *value_local;
  guint prop_id_local;
  GObject *object_local;
  
  if ((prop_id == 0) || (0xe < prop_id - 1)) {
    g_assertion_message_expr
              (0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/f1u77y[P]headphones-plug-detector/build_O0/mpris-generated/mpris-player.c"
               ,0xb6a,"media_player2_player_proxy_get_property","prop_id != 0 && prop_id - 1 < 15");
  }
  pGVar1 = _media_player2_player_property_info_pointers[prop_id - 1];
  uVar2 = g_dbus_proxy_get_type();
  uVar2 = g_type_check_instance_cast(object,uVar2);
  lVar3 = g_dbus_proxy_get_cached_property(uVar2,pGVar1->name);
  if (((ulong)pGVar1[1].name & 1) == 0) {
    if (lVar3 != 0) {
      g_dbus_gvariant_to_gvalue(lVar3,value);
    }
  }
  else {
    g_value_set_variant(value,lVar3);
  }
  if (lVar3 != 0) {
    g_variant_unref(lVar3);
  }
  return;
}

Assistant:

static void
media_player2_player_proxy_get_property (GObject      *object,
  guint         prop_id,
  GValue       *value,
  GParamSpec   *pspec G_GNUC_UNUSED)
{
  const _ExtendedGDBusPropertyInfo *info;
  GVariant *variant;
  g_assert (prop_id != 0 && prop_id - 1 < 15);
  info = (const _ExtendedGDBusPropertyInfo *) _media_player2_player_property_info_pointers[prop_id - 1];
  variant = g_dbus_proxy_get_cached_property (G_DBUS_PROXY (object), info->parent_struct.name);
  if (info->use_gvariant)
    {
      g_value_set_variant (value, variant);
    }
  else
    {
      if (variant != NULL)
        g_dbus_gvariant_to_gvalue (variant, value);
    }
  if (variant != NULL)
    g_variant_unref (variant);
}